

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0,_0>
     ::run(Matrix<double,__1,_1,_0,__1,_1> *dst,
          CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *src)

{
  double *pdVar1;
  double *pdVar2;
  long end;
  long start;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  Index index;
  long lVar7;
  
  end = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar6 = end / 2;
  start = lVar6 * 2;
  for (lVar7 = 0; SBORROW8(lVar7,start) != lVar7 + lVar6 * -2 < 0; lVar7 = lVar7 + 2) {
    pdVar1 = (src->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + lVar7;
    uVar3 = *(uint *)((long)pdVar1 + 4);
    uVar4 = *(undefined4 *)(pdVar1 + 1);
    uVar5 = *(uint *)((long)pdVar1 + 0xc);
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             + lVar7;
    *(undefined4 *)pdVar2 = *(undefined4 *)pdVar1;
    *(uint *)((long)pdVar2 + 4) = uVar3 ^ 0x80000000;
    *(undefined4 *)(pdVar2 + 1) = uVar4;
    *(uint *)((long)pdVar2 + 0xc) = uVar5 ^ 0x80000000;
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (src,dst,start,end);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }